

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgSetLocalSurplusRefinement
               (void *grid,double tolerance,char *sRefinementType,int output,int *level_limits,
               double *scale_correction)

{
  TypeRefinement TVar1;
  ostream *poVar2;
  allocator<char> local_61;
  string local_60;
  TypeRefinement local_3c;
  double *pdStack_38;
  TypeRefinement ref_type;
  double *scale_correction_local;
  int *level_limits_local;
  char *pcStack_20;
  int output_local;
  char *sRefinementType_local;
  double tolerance_local;
  void *grid_local;
  
  pdStack_38 = scale_correction;
  scale_correction_local = (double *)level_limits;
  level_limits_local._4_4_ = output;
  pcStack_20 = sRefinementType;
  sRefinementType_local = (char *)tolerance;
  tolerance_local = (double)grid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,sRefinementType,&local_61);
  TVar1 = TasGrid::IO::getTypeRefinementString(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_3c = TVar1;
  if (TVar1 == refine_none) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect refinement type: ");
    poVar2 = std::operator<<(poVar2,pcStack_20);
    poVar2 = std::operator<<(poVar2,", defaulting to type_classic.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (local_3c == refine_none) {
    local_3c = refine_classic;
  }
  TasGrid::TasmanianSparseGrid::setSurplusRefinement
            ((TasmanianSparseGrid *)tolerance_local,(double)sRefinementType_local,local_3c,
             level_limits_local._4_4_,(int *)scale_correction_local,pdStack_38);
  return;
}

Assistant:

void tsgSetLocalSurplusRefinement(void *grid, double tolerance, const char * sRefinementType, int output, const int *level_limits, const double *scale_correction){
    TypeRefinement ref_type = IO::getTypeRefinementString(sRefinementType);
    #ifndef NDEBUG
    if (ref_type == refine_none){ cerr << "WARNING: incorrect refinement type: " << sRefinementType << ", defaulting to type_classic." << endl; }
    #endif // NDEBUG
    if (ref_type == refine_none){ ref_type = refine_classic; }
    ((TasmanianSparseGrid*) grid)->setSurplusRefinement(tolerance, ref_type, output, level_limits, scale_correction);
}